

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O3

JsValueRef
Debugger::GetObjectFromHandle
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  char16_t *format;
  JsValueRef local_30;
  JsValueRef properties;
  int objectHandle;
  
  local_30 = (JsValueRef)0x0;
  if (1 < argumentCount) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                            (arguments[1],(int *)((long)&properties + 4));
    if (jsErrorCode == JsNoError) {
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetObjectFromHandle)
                              (properties._4_4_,&local_30);
      if (jsErrorCode == JsNoError) {
        return local_30;
      }
      pPVar1 = PAL_get_stderr(0);
      pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsDiagGetObjectFromHandle(objectHandle, &properties) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    else {
      pPVar1 = PAL_get_stderr(0);
      pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar1,format,(ulong)jsErrorCode,pWVar2);
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::GetObjectFromHandle(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsValueRef properties = JS_INVALID_REFERENCE;
    int objectHandle;

    if (argumentCount > 1)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagGetObjectFromHandle(objectHandle, &properties));
    }

    return properties;
}